

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall
bloaty::Rollup::CreateRows
          (Rollup *this,RollupRow *row,Rollup *base,Options *options,bool is_toplevel)

{
  pointer pRVar1;
  long lVar2;
  int iVar3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
  _Var4;
  __node_base *p_Var5;
  long *plVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long local_58;
  long lStack_50;
  
  if (base != (Rollup *)0x0) {
    dVar7 = Percent(this->vm_total_ - base->vm_total_,base->vm_total_);
    row->vmpercent = dVar7;
    dVar7 = Percent(this->file_total_ - base->file_total_,base->file_total_);
    row->filepercent = dVar7;
  }
  p_Var5 = &(this->children_)._M_h._M_before_begin;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    _Var4._M_cur = (__node_type *)p_Var5[5]._M_nxt;
    auVar9 = *(undefined1 (*) [16])_Var4._M_cur;
    if (base == (Rollup *)0x0) {
      plVar6 = (long *)0x0;
    }
    else {
      _Var4._M_cur = (__node_type *)
                     std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(base->children_)._M_h,(key_type *)(p_Var5 + 1));
      if (_Var4._M_cur == (__node_type *)0x0) {
        plVar6 = (long *)0x0;
      }
      else {
        plVar6 = *(long **)((long)_Var4._M_cur + 0x28);
        local_58 = auVar9._0_8_;
        lStack_50 = auVar9._8_8_;
        auVar9._0_8_ = local_58 - *plVar6;
        auVar9._8_8_ = lStack_50 - plVar6[1];
      }
    }
    auVar8._0_4_ = -(uint)(auVar9._0_4_ == 0);
    auVar8._4_4_ = -(uint)(auVar9._4_4_ == 0);
    auVar8._8_4_ = -(uint)(auVar9._8_4_ == 0);
    auVar8._12_4_ = -(uint)(auVar9._12_4_ == 0);
    iVar3 = movmskps((int)_Var4._M_cur,auVar8);
    if (iVar3 != 0xf) {
      std::vector<bloaty::RollupRow,std::allocator<bloaty::RollupRow>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<bloaty::RollupRow,std::allocator<bloaty::RollupRow>> *)
                 &row->sorted_children,(key_type *)(p_Var5 + 1));
      pRVar1 = (row->sorted_children).
               super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_58 = auVar9._0_8_;
      lStack_50 = auVar9._8_8_;
      pRVar1[-1].size.vm = local_58;
      pRVar1[-1].size.file = lStack_50;
      if (plVar6 != (long *)0x0) {
        lVar2 = plVar6[1];
        pRVar1[-1].old_size.vm = *plVar6;
        pRVar1[-1].old_size.file = lVar2;
      }
    }
  }
  SortAndAggregateRows(this,row,base,options,is_toplevel);
  return;
}

Assistant:

void Rollup::CreateRows(RollupRow* row, const Rollup* base,
                        const Options& options, bool is_toplevel) const {
  if (base) {
    // For a diff, the percentage is a comparison against the previous size of
    // the same label at the same level.
    row->vmpercent = Percent(vm_total_ - base->vm_total_, base->vm_total_);
    row->filepercent = Percent(file_total_ - base->file_total_, base->file_total_);
  }

  for (const auto& value : children_) {
    int64_t vm_total = value.second->vm_total_;
    int64_t file_total = value.second->file_total_;
    Rollup* base_child = nullptr;

    if (base) {
      // Reassign sizes to base during a diff to compare to target sizes.
      auto it = base->children_.find(value.first);
      if (it != base->children_.end()) {
        base_child = it->second.get();
        vm_total -= base_child->vm_total_;
        file_total -= base_child->file_total_;
      }
    }

    if (vm_total != 0 || file_total != 0) {
      row->sorted_children.emplace_back(value.first);
      RollupRow& child_row = row->sorted_children.back();
      child_row.size.vm = vm_total;
      child_row.size.file = file_total;

      // Preserve the old size for this label in the RollupRow output.
      // If there is a diff base, the old sizes come from the size of the label
      // in that base.  Otherwise, the old size stays 0.
      if (base_child) {
        child_row.old_size.vm = base_child->vm_total_;
        child_row.old_size.file = base_child->file_total_;
      }
    }
  }

  SortAndAggregateRows(row, base, options, is_toplevel);
}